

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

RTPTime jrtplib::RTPTime::CurrentTime(void)

{
  double dVar1;
  double tMono0;
  timespec tpMono;
  double tMono;
  double tSys;
  timespec tpMono_1;
  timespec tpSys;
  
  if (CurrentTime::s_initialized) {
    clock_gettime(1,(timespec *)&tMono0);
    dVar1 = RTPTime_timespecToDouble((timespec *)&tMono0);
    RTPTime((RTPTime *)&tpSys.tv_nsec,dVar1 + CurrentTime::s_startOffet);
  }
  else {
    CurrentTime::s_initialized = true;
    clock_gettime(0,(timespec *)&tpMono_1.tv_nsec);
    clock_gettime(1,(timespec *)&tSys);
    dVar1 = RTPTime_timespecToDouble((timespec *)&tpMono_1.tv_nsec);
    tpMono.tv_nsec = (__syscall_slong_t)RTPTime_timespecToDouble((timespec *)&tSys);
    CurrentTime::s_startOffet = dVar1 - (double)tpMono.tv_nsec;
    RTPTime((RTPTime *)&tpSys.tv_nsec,dVar1);
  }
  return (RTPTime)(double)tpSys.tv_nsec;
}

Assistant:

inline RTPTime RTPTime::CurrentTime()
{
	static bool s_initialized = false;
	static double s_startOffet = 0;

	if (!s_initialized)
	{
		s_initialized = true;

		// Get the corresponding times in system time and monotonic time
		struct timespec tpSys, tpMono;

		clock_gettime(CLOCK_REALTIME, &tpSys);
		clock_gettime(CLOCK_MONOTONIC, &tpMono);

		double tSys = RTPTime_timespecToDouble(tpSys);
		double tMono = RTPTime_timespecToDouble(tpMono);

		s_startOffet = tSys - tMono;
		return tSys;
	}

	struct timespec tpMono;
	clock_gettime(CLOCK_MONOTONIC, &tpMono);

	double tMono0 = RTPTime_timespecToDouble(tpMono);
	return tMono0 + s_startOffet;
}